

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.cpp
# Opt level: O0

int __thiscall RegEx::PreProcessClosure(RegEx *this)

{
  char *pcVar1;
  bool bVar2;
  RegEx *this_local;
  
  PreProcessLiterals(this);
  while( true ) {
    bVar2 = false;
    if (this->m_CurPreProcChar != '\0') {
      pcVar1 = strchr("*+?",(int)this->m_CurPreProcChar);
      bVar2 = pcVar1 != (char *)0x0;
    }
    if (!bVar2) break;
    std::__cxx11::string::operator+=((string *)&this->m_PostStrRegEx,this->m_CurPreProcChar);
    pcVar1 = this->m_InfixRegEx;
    this->m_InfixRegEx = pcVar1 + 1;
    this->m_CurPreProcChar = *pcVar1;
  }
  return 0;
}

Assistant:

int RegEx::PreProcessClosure() {
	PreProcessLiterals();
	while (m_CurPreProcChar != '\0' && strchr("*+?",m_CurPreProcChar) != NULL) {
		m_PostStrRegEx += m_CurPreProcChar;
		m_CurPreProcChar = *(m_InfixRegEx++);
	}
	return 0;
}